

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_object.cxx
# Opt level: O0

bool __thiscall xray_re::xr_object::load_object(xr_object *this,char *path)

{
  xr_error anon_var_0;
  xr_reader *local_40;
  xr_reader *s;
  xr_reader *pxStack_30;
  bool status;
  xr_reader *r;
  xr_file_system *fs;
  char *path_local;
  xr_object *this_local;
  
  fs = (xr_file_system *)path;
  path_local = (char *)this;
  r = (xr_reader *)xr_file_system::instance();
  pxStack_30 = xr_file_system::r_open((xr_file_system *)r,(char *)fs);
  if (pxStack_30 == (xr_reader *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    s._7_1_ = 0;
    local_40 = xr_reader::open_chunk(pxStack_30,0x7777);
    if (local_40 != (xr_reader *)0x0) {
      (*(this->super_xr_surface_factory)._vptr_xr_surface_factory[8])(this,local_40);
      s._7_1_ = 1;
      xr_reader::close_chunk(pxStack_30,&local_40);
    }
    xr_file_system::r_close((xr_file_system *)r,&stack0xffffffffffffffd0);
    this_local._7_1_ = (bool)(s._7_1_ & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool xr_object::load_object(const char* path)
{
	xr_file_system& fs = xr_file_system::instance();
	xr_reader* r = fs.r_open(path);
	if (r == 0)
		return false;
	bool status = false;
	xr_reader* s = r->open_chunk(EOBJ_CHUNK_MAIN);
	if (s) {
		try {
			load_object(*s);
			status = true;
		} catch (xr_error) {
			clear();
		}
		r->close_chunk(s);
	}
	fs.r_close(r);
	return status;
}